

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_main.c
# Opt level: O1

int cmdUsage(void)

{
  char *str;
  size_t sVar1;
  cmd_entry_t *pcVar2;
  char **ppcVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  lVar6 = 0;
  printf("Usage:\n  bee2cmd {");
  if (1 < _count) {
    pcVar2 = _cmds;
    lVar4 = 0;
    do {
      printf("%s|",pcVar2->name);
      lVar6 = lVar4 + 1;
      pcVar2 = pcVar2 + 1;
      uVar5 = lVar4 + 2;
      lVar4 = lVar6;
    } while (uVar5 < _count);
  }
  printf("%s} ...\n",_cmds[lVar6].name);
  if (_count != 0) {
    ppcVar3 = &_cmds[0].descr;
    uVar5 = 0;
    do {
      str = ((cmd_entry_t *)(ppcVar3 + -1))->name;
      sVar1 = strLen(str);
      printf("    %s%*s%s\n",str,(ulong)(0xc - (int)sVar1),"",*ppcVar3);
      uVar5 = uVar5 + 1;
      ppcVar3 = ppcVar3 + 3;
    } while (uVar5 < _count);
  }
  return -1;
}

Assistant:

int cmdUsage()
{
	size_t pos;
	// перечень команд
	printf(
		"Usage:\n"
		"  bee2cmd {");
	for (pos = 0; pos + 1 < _count; ++pos)
		printf("%s|", _cmds[pos].name);
	printf("%s} ...\n", _cmds[pos].name);
	// краткая справка по каждой команде
	for (pos = 0; pos < _count; ++pos)
		printf("    %s%*s%s\n",
			_cmds[pos].name,
			(int)(12 - strLen(_cmds[pos].name)), "",
			_cmds[pos].descr);
	return -1;
}